

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O2

void aes_sw_setkey(ssh_cipher *ciph,void *vkey)

{
  ssh_cipher *__s;
  ushort *puVar1;
  ulong uVar2;
  uint *puVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  size_t i_1;
  ulong uVar17;
  long lVar18;
  size_t i_2;
  ulong uVar19;
  ulong uVar20;
  size_t i;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  ushort uVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ushort uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  ssh_cipher *psVar37;
  undefined4 local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  int local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  uint8_t inblk [16];
  
  iVar25 = ciph->vt->real_keybits;
  uVar36 = (ulong)(long)iVar25 >> 5;
  *(int *)&ciph[-0xc].vt = (iVar25 >> 5) + 6;
  uVar2 = uVar36 * 4 + 0x1c;
  uVar22 = uVar2 & 0xffffffff;
  __s = ciph + -0x2a;
  memset(__s,0,0xf0);
  inblk[0] = '\0';
  inblk[1] = '\0';
  inblk[2] = '\0';
  inblk[3] = '\0';
  inblk[4] = '\0';
  inblk[5] = '\0';
  inblk[6] = '\0';
  inblk[7] = '\0';
  inblk[8] = '\0';
  inblk[9] = '\0';
  inblk[10] = '\0';
  inblk[0xb] = '\0';
  inblk[0xc] = '\0';
  inblk[0xd] = '\0';
  inblk[0xe] = '\0';
  inblk[0xf] = '\0';
  uVar28 = uVar36 * -2;
  uVar17 = 0xfffffffffffffffe;
  uVar32 = 0;
  iVar25 = 0;
  local_bc = 0;
  psVar37 = __s;
  do {
    iVar29 = (int)uVar17;
    local_88 = uVar36;
    local_80 = uVar22;
    if (uVar32 == uVar22) {
      smemclr(inblk,0x10);
      smemclr(&local_e8,0x10);
      for (uVar17 = 8; uVar17 < uVar22 * 2; uVar17 = uVar17 + 8) {
        puVar3 = (uint *)((long)&ciph[-0x2a].vt + uVar17 * 2);
        *puVar3 = ~*puVar3;
        puVar3 = (uint *)((long)ciph + uVar17 * 2 + -0x146);
        *puVar3 = ~*puVar3;
      }
      for (lVar18 = 0; (uVar2 >> 2 & 0x3fffffff) << 4 != lVar18; lVar18 = lVar18 + 2) {
        *(ulong *)((long)&ciph[-0xa2].vt + lVar18 * 4) =
             (ulong)*(ushort *)((long)&ciph[-0x2a].vt + lVar18) * 0x1000100010001;
      }
      return;
    }
    if (uVar32 < uVar36) {
      uVar15 = *(uint *)((long)vkey + uVar32 * 4);
      inblk[4] = '\0';
      inblk[5] = '\0';
      inblk[6] = '\0';
      inblk[7] = '\0';
      inblk[0] = (char)uVar15;
      inblk[1] = (char)(uVar15 >> 8);
      inblk[2] = (char)(uVar15 >> 0x10);
      inblk[3] = (char)(uVar15 >> 0x18);
      uVar19 = ((ulong)(uVar15 >> 7 ^ uVar15) & 0xaa00aa00aa00aa) * 0x81 ^ inblk._0_8_;
      uVar19 = ((uVar19 >> 0xe ^ uVar19) & 0xcccc0000cccc) * 0x4001 ^ uVar19;
      uVar17 = (ulong)((uint)uVar19 & 0xf0f0f0f0) * 0x10000001;
      uVar19 = uVar17 ^ uVar19;
      uVar20 = uVar19 >> 8 & 0xff00ff00ff00ff;
      uVar21 = uVar20 << 8 ^ uVar19;
      local_e8 = CONCAT22((short)uVar20,(short)uVar21);
      local_e4 = CONCAT22((short)(uVar19 >> 0x18),(short)(uVar21 >> 0x10)) & 0xffffff;
      local_e0 = CONCAT22((short)(uVar20 >> 0x20),(short)(uVar21 >> 0x20));
      local_dc = (uint)CONCAT12((char)(uVar17 >> 0x38),(short)(uVar21 >> 0x30));
    }
    else {
      for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
        *(ushort *)((long)&local_e8 + lVar18 * 2) =
             *(ushort *)((long)&__s[(uVar17 >> 3 & 0x1fffffff) * 2].vt + lVar18 * 2) >>
             ((char)uVar32 * '\x04' - 4U & 0xc);
      }
      if (uVar32 % uVar36 == 0) {
        for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
          uVar33 = *(ushort *)((long)&local_e8 + lVar18 * 2);
          *(ushort *)((long)&local_e8 + lVar18 * 2) = (uVar33 >> 1 | uVar33 * 8) & 0xf;
        }
LAB_0014711a:
        local_8c = local_e4 ^ local_e0;
        local_b4 = (uint)(local_e8._2_2_ ^ local_dc._2_2_);
        local_90 = local_dc._2_2_ ^ local_e0;
        local_98 = local_dc._2_2_ ^ local_e4;
        uVar33 = local_e0._2_2_ ^ (ushort)local_dc;
        uVar26 = (ushort)(local_b4 ^ local_8c);
        uVar34 = (uint)(local_e4._2_2_ ^ uVar26);
        local_e4 = local_e4 ^ uVar34;
        uVar34 = uVar34 ^ local_dc;
        local_9c = local_e4 ^ uVar33;
        local_c0 = uVar34 ^ local_90;
        local_94 = local_9c ^ local_c0;
        uVar27 = local_94 & local_8c ^ local_c0 & local_90;
        uVar30 = local_9c & local_98 ^ local_c0 & local_90;
        uVar15 = uVar33 ^ local_e8;
        local_b0 = local_e8._2_2_ ^ uVar15;
        uVar16 = local_e4 & (local_b4 ^ local_8c);
        local_c8 = uVar33 ^ local_c0;
        uVar35 = uVar34 ^ uVar16 ^ (local_e4 ^ local_e8) & (local_b0 ^ local_98) ^ uVar27;
        uVar27 = local_b0 & uVar15 ^ local_c8 ^ local_c8 & local_b4 ^ local_b4 ^ uVar27;
        local_a0 = uVar15 ^ local_dc._2_2_;
        uVar34 = (local_e0 ^ uVar15) & local_e8 ^ local_98 ^ local_9c ^ uVar16 ^ uVar30;
        uVar30 = local_c8 & local_b4 ^ (uint)local_dc._2_2_ ^
                 (local_c0 ^ local_e8) & local_a0 ^ local_c8 ^ uVar30;
        uVar16 = uVar27 & uVar35;
        uVar35 = uVar35 ^ uVar34;
        uVar31 = (uVar30 ^ uVar16) & uVar35 ^ uVar34;
        uVar23 = (uVar34 ^ uVar16) & (uVar30 ^ uVar27);
        uVar34 = uVar23 ^ uVar30;
        uVar23 = (uVar23 ^ uVar16) & uVar30;
        uVar27 = uVar27 ^ uVar23;
        uVar35 = (uVar23 ^ uVar30 ^ uVar16) & uVar31 ^ uVar35;
        local_ac = local_e4 & uVar27;
        uVar16 = uVar27 ^ uVar34;
        uVar14 = (ushort)uVar35 ^ (ushort)uVar16;
        local_a8 = (local_e4 ^ local_e8) & uVar16;
        uVar16 = uVar16 & (local_b0 ^ local_98);
        local_a4 = local_e8 & uVar34;
        local_c8 = local_c8 & (uVar35 ^ uVar31);
        local_cc = (uVar35 ^ uVar31) & local_b4;
        local_c4 = uVar15 & uVar35;
        local_d4 = (local_c0 ^ local_e8) & uVar31;
        uVar33 = (ushort)(uVar31 ^ uVar34);
        uVar13 = uVar14 ^ uVar33;
        local_c0 = local_c0 & (uVar31 ^ uVar34);
        uVar11 = (ushort)local_94 & uVar13;
        uVar13 = uVar13 & (ushort)local_8c;
        local_d0 = uVar34 & (local_e0 ^ uVar15) ^ uVar16;
        uVar5 = (ushort)uVar35 & (ushort)local_b0 ^ (ushort)local_d4;
        local_d4 = local_d4 ^ local_a4;
        uVar10 = (ushort)local_ac ^ (ushort)local_c8;
        uVar8 = (ushort)local_c0 ^ (ushort)local_c8 ^ uVar11;
        uVar33 = uVar33 & (ushort)local_90 ^ uVar13;
        uVar7 = (ushort)local_cc ^ (ushort)local_a4 ^ uVar10;
        uVar9 = uVar33 ^ (ushort)local_c4;
        uVar6 = (ushort)local_9c & uVar14 ^ uVar11 ^ uVar9;
        uVar9 = uVar9 ^ (ushort)uVar16 ^ (ushort)uVar27 & uVar26;
        uVar11 = (ushort)local_c4 ^ uVar8;
        uVar12 = (ushort)local_a8 ^ uVar9;
        uVar10 = uVar10 ^ uVar12;
        uVar26 = (ushort)uVar31 & (ushort)local_a0 ^ uVar7 ^ uVar6;
        local_e4 = CONCAT22(uVar12 ^ (ushort)local_d4,(ushort)local_d0 ^ uVar26);
        local_e8 = CONCAT22(~(uVar5 ^ (ushort)local_cc ^ uVar6),~(uVar7 ^ uVar5 ^ uVar33));
        local_e0 = CONCAT22(~(uVar14 & (ushort)local_98 ^ uVar13 ^ uVar11 ^ uVar26),uVar10);
        local_dc = CONCAT22(uVar9 ^ uVar8,~(uVar11 ^ uVar10));
        local_b8 = iVar29;
        local_78 = uVar32;
        local_70 = uVar28;
        if (uVar32 % uVar36 == 0) {
          if (9 < local_bc) {
            __assert_fail("rconpos < lenof(aes_key_setup_round_constants)",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/aes-sw.c"
                          ,0x2b4,"void aes_sliced_key_setup(aes_sliced_key *, const void *, size_t)"
                         );
          }
          bVar4 = aes_key_setup_round_constants[local_bc];
          for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
            puVar1 = (ushort *)((long)&local_e8 + lVar18 * 2);
            *puVar1 = *puVar1 ^ (ushort)((bVar4 >> ((uint)lVar18 & 0x1f) & 1) != 0);
          }
          local_bc = local_bc + 1;
        }
      }
      else if (((uint)uVar32 & 7) == 4 && uVar36 == 8) goto LAB_0014711a;
      for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
        puVar1 = (ushort *)((long)&local_e8 + lVar18 * 2);
        *puVar1 = *puVar1 ^ *(ushort *)((long)&__s[(uVar28 >> 3 & 0x1fffffff) * 2].vt + lVar18 * 2)
                            >> (((char)uVar32 - (char)uVar36) * '\x04' & 0xcU);
      }
    }
    for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
      puVar1 = (ushort *)((long)&psVar37->vt + lVar18 * 2);
      *puVar1 = *puVar1 | (ushort)((*(ushort *)((long)&local_e8 + lVar18 * 2) & 0xf) <<
                                  ((byte)iVar25 & 0x1f));
    }
    iVar24 = iVar25 + 4;
    iVar25 = iVar24;
    if (iVar24 == 0x10) {
      iVar25 = 0;
    }
    psVar37 = psVar37 + (ulong)(iVar24 == 0x10) * 2;
    uVar32 = uVar32 + 1;
    uVar17 = (ulong)(iVar29 + 2);
    uVar28 = uVar28 + 2;
  } while( true );
}

Assistant:

static void aes_sw_setkey(ssh_cipher *ciph, const void *vkey)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    aes_sliced_key_setup(&ctx->sk, vkey, ctx->ciph.vt->real_keybits);
}